

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

completion * __thiscall
mjs::interpreter::impl::operator()
          (completion *__return_storage_ptr__,impl *this,labelled_statement *s)

{
  pointer *ppbVar1;
  pointer pbVar2;
  iterator __position;
  statement *s_00;
  __normal_iterator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_*,_std::vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>_>
  _Var3;
  wostream *pwVar4;
  native_error_exception *this_00;
  pointer pbVar5;
  wostringstream woss;
  wstring local_1f8;
  wstring_view local_1d8;
  wchar_t *local_1c8;
  size_t local_1c0;
  wstring_view local_1a8;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_198 [23];
  
  pbVar2 = (this->label_set_).
           super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (this->label_set_).
           super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar2 && (labelled_statement *)this->labels_valid_for_ != s) {
    (this->label_set_).
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
    pbVar5 = pbVar2;
  }
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>*,std::vector<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,std::allocator<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::wstring_const>>
                    (pbVar2,pbVar5,&s->id_);
  __position._M_current =
       (this->label_set_).
       super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var3._M_current == __position._M_current) {
    local_198[0]._M_str = (s->id_)._M_dataplus._M_p;
    local_198[0]._M_len = (s->id_)._M_string_length;
    if (_Var3._M_current ==
        (this->label_set_).
        super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,std::allocator<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>>
      ::_M_realloc_insert<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                ((vector<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,std::allocator<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>>
                  *)&this->label_set_,__position,local_198);
    }
    else {
      (__position._M_current)->_M_len = local_198[0]._M_len;
      (__position._M_current)->_M_str = local_198[0]._M_str;
      ppbVar1 = &(this->label_set_).
                 super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppbVar1 = *ppbVar1 + 1;
    }
    s_00 = (s->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
           _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
    this->labels_valid_for_ = s_00;
    eval(__return_storage_ptr__,this,s_00);
    return __return_storage_ptr__;
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_198);
  pwVar4 = std::operator<<((wostream *)local_198,"Duplicate label ");
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
            (pwVar4,(s->id_)._M_dataplus._M_p,(s->id_)._M_string_length);
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  stack_trace_abi_cxx11_(&local_1f8,this);
  local_1d8._M_len = local_1f8._M_string_length;
  local_1d8._M_str = local_1f8._M_dataplus._M_p;
  std::__cxx11::wstringbuf::str();
  local_1a8._M_len = local_1c0;
  local_1a8._M_str = local_1c8;
  native_error_exception::native_error_exception(this_00,syntax,&local_1d8,&local_1a8);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

completion operator()(const labelled_statement& s) {
        if (labels_valid_for_ != &s) {
            label_set_.clear();
        }
        if (std::find(label_set_.begin(), label_set_.end(), s.id()) != label_set_.end()) {
            std::wostringstream woss;
            woss << "Duplicate label " << s.id();
            throw native_error_exception(native_error_type::syntax, stack_trace(), woss.str());
        }
        label_set_.push_back(s.id());
        labels_valid_for_ = &s.s();
        return eval(s.s());
    }